

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int items_count,float items_height)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiTable *table;
  ImGuiListClipperData *pIVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  ImGuiListClipperData *pIVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  table = GImGui->CurrentTable;
  if ((table != (ImGuiTable *)0x0) && (table->IsInsideRow == true)) {
    ImGui::TableEndRow(table);
  }
  this->StartPosY = (pIVar4->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = items_count;
  this->DisplayStart = -1;
  this->DisplayEnd = 0;
  iVar3 = pIVar6->ClipperTempDataStacked;
  uVar12 = (long)iVar3 + 1;
  iVar11 = (int)uVar12;
  pIVar6->ClipperTempDataStacked = iVar11;
  iVar7 = (pIVar6->ClipperTempData).Size;
  if (iVar7 <= iVar3) {
    iVar13 = (pIVar6->ClipperTempData).Capacity;
    if (iVar13 <= iVar3) {
      if (iVar13 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar13 / 2 + iVar13;
      }
      if (iVar13 <= iVar11) {
        iVar13 = iVar11;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar8 = (ImGuiListClipperData *)
               (*GImAllocatorAllocFunc)((long)iVar13 * 0x28,GImAllocatorUserData);
      pIVar5 = (pIVar6->ClipperTempData).Data;
      if (pIVar5 != (ImGuiListClipperData *)0x0) {
        memcpy(pIVar8,pIVar5,(long)(pIVar6->ClipperTempData).Size * 0x28);
        pIVar5 = (pIVar6->ClipperTempData).Data;
        if ((pIVar5 != (ImGuiListClipperData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar6->ClipperTempData).Data = pIVar8;
      (pIVar6->ClipperTempData).Capacity = iVar13;
      iVar7 = (pIVar6->ClipperTempData).Size;
    }
    if (iVar7 <= iVar3) {
      lVar9 = uVar12 - (long)iVar7;
      lVar10 = (long)iVar7 * 0x28;
      do {
        pIVar5 = (pIVar6->ClipperTempData).Data;
        *(undefined8 *)((long)&(pIVar5->Ranges).Data + lVar10) = 0;
        puVar2 = (undefined8 *)((long)&pIVar5->ItemsFrozen + lVar10);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)&pIVar5->ListClipper + lVar10);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar10 = lVar10 + 0x28;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    (pIVar6->ClipperTempData).Size = iVar11;
    uVar12 = (ulong)(uint)pIVar6->ClipperTempDataStacked;
  }
  pIVar5 = (pIVar6->ClipperTempData).Data;
  pIVar8 = pIVar5 + (long)(int)uVar12 + -1;
  ImGuiListClipperData::Reset(pIVar8,this);
  pIVar5[(long)(int)uVar12 + -1].LossynessOffset = (pIVar4->DC).CursorStartPosLossyness.y;
  this->TempData = pIVar8;
  return;
}

Assistant:

void ImGuiListClipper::Begin(int items_count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ImGuiTable* table = g.CurrentTable)
        if (table->IsInsideRow)
            ImGui::TableEndRow(table);

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = items_count;
    DisplayStart = -1;
    DisplayEnd = 0;

    // Acquire temporary buffer
    if (++g.ClipperTempDataStacked > g.ClipperTempData.Size)
        g.ClipperTempData.resize(g.ClipperTempDataStacked, ImGuiListClipperData());
    ImGuiListClipperData* data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
    data->Reset(this);
    data->LossynessOffset = window->DC.CursorStartPosLossyness.y;
    TempData = data;
}